

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::~SQSharedState(SQSharedState *this)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  RefTable *in_RDI;
  SQCollectable_conflict *nx;
  SQCollectable_conflict *t;
  void *in_stack_ffffffffffffffc8;
  SQStringTable *in_stack_ffffffffffffffd0;
  long *local_10;
  
  if (in_RDI[8]._buckets != (RefNode **)0x0) {
    (*(code *)in_RDI[8]._buckets)(in_RDI[8]._freelist,0);
    in_RDI[8]._buckets = (RefNode **)0x0;
  }
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  (**(code **)(*(long *)&((in_RDI[2]._nodes)->obj).super_SQObject + 0x28))();
  (*(code *)(*in_RDI[2]._buckets)[1].obj.super_SQObject._unVal)();
  (**(code **)(*(long *)&(in_RDI->_freelist->obj).super_SQObject + 0x28))();
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  while (bVar3 = sqvector<SQObjectPtr,_unsigned_int>::empty
                           ((sqvector<SQObjectPtr,_unsigned_int> *)in_RDI->_buckets),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd0 =
         (SQStringTable *)
         sqvector<SQObjectPtr,_unsigned_int>::back
                   ((sqvector<SQObjectPtr,_unsigned_int> *)in_RDI->_buckets);
    ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
    sqvector<SQObjectPtr,_unsigned_int>::pop_back((sqvector<SQObjectPtr,_unsigned_int> *)0x162eab);
  }
  (**(code **)(*(long *)&((in_RDI[3]._freelist)->obj).super_SQObject + 0x28))();
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
  RefTable::Finalize(in_RDI);
  plVar1 = (long *)in_RDI[3]._slotused;
  if (plVar1 != (long *)0x0) {
    plVar1[1] = plVar1[1] + 1;
    while (local_10 = plVar1, local_10 != (long *)0x0) {
      (**(code **)(*local_10 + 0x28))();
      plVar1 = (long *)local_10[3];
      if (plVar1 != (long *)0x0) {
        plVar1[1] = plVar1[1] + 1;
      }
      lVar2 = local_10[1];
      local_10[1] = lVar2 + -1;
      if (lVar2 + -1 == 0) {
        (**(code **)(*local_10 + 0x10))();
      }
    }
  }
  while (in_RDI[3]._slotused != 0) {
    *(long *)(in_RDI[3]._slotused + 8) = *(long *)(in_RDI[3]._slotused + 8) + 1;
    (**(code **)(*(long *)in_RDI[3]._slotused + 0x10))();
  }
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector((sqvector<SQObjectPtr,_unsigned_int> *)0x1630b1);
  sq_vm_free((SQAllocContext)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x1630c7);
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector((sqvector<SQObjectPtr,_unsigned_int> *)0x1630d7);
  sq_vm_free((SQAllocContext)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x1630ed);
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector((sqvector<SQObjectPtr,_unsigned_int> *)0x1630fd);
  sq_vm_free((SQAllocContext)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x163113);
  SQStringTable::~SQStringTable(in_stack_ffffffffffffffd0);
  sq_vm_free((SQAllocContext)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x163139);
  if (in_RDI[8]._alloc_ctx != (SQAllocContext)0x0) {
    sq_vm_free((SQAllocContext)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x163165);
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  RefTable::~RefTable((RefTable *)0x163270);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

SQSharedState::~SQSharedState()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    _constructorstr.Null();
    _table(_registry)->Finalize();
    _table(_consts)->Finalize();
    _table(_metamethodsmap)->Finalize();
    _registry.Null();
    _consts.Null();
    _metamethodsmap.Null();
    while(!_systemstrings->empty()) {
        _systemstrings->back().Null();
        _systemstrings->pop_back();
    }
    _thread(_root_vm)->Finalize();
    _root_vm.Null();
    _table_default_delegate.Null();
    _array_default_delegate.Null();
    _string_default_delegate.Null();
    _number_default_delegate.Null();
    _closure_default_delegate.Null();
    _generator_default_delegate.Null();
    _thread_default_delegate.Null();
    _class_default_delegate.Null();
    _instance_default_delegate.Null();
    _weakref_default_delegate.Null();
    _userdata_default_delegate.Null();
    _refs_table.Finalize();
#ifndef NO_GARBAGE_COLLECTOR
    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_gc_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
        }
    }
    assert(_gc_chain==NULL); //just to proove a theory
    while(_gc_chain){
        _gc_chain->_uiRef++;
        _gc_chain->Release();
    }
#endif

    sq_delete(_alloc_ctx, _types, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _systemstrings, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _metamethodnames, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _stringtable,SQStringTable);
    if(_scratchpad)SQ_FREE(_alloc_ctx,_scratchpad,_scratchpadsize);
}